

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadControllerWeights(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  reference puVar6;
  pointer ppVar7;
  undefined4 extraout_var_01;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_430;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_428;
  iterator it_1;
  char *text_1;
  string local_410;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e8;
  iterator it;
  size_t numWeights;
  char *text;
  string local_258;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_c0;
  uint local_9c;
  char *pcStack_98;
  int indexOffset;
  char *attrSource;
  char *pcStack_88;
  int indexSource;
  char *attrSemantic;
  uint local_6c;
  undefined1 local_68 [4];
  int indexSemantic;
  InputChannel channel;
  size_t vertexCount;
  int indexCount;
  Controller *pController_local;
  ColladaParser *this_local;
  
  uVar2 = GetAttribute(this,"count");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
  channel.mResolved = (Accessor *)(long)iVar3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pController->mWeightCounts,(size_type)channel.mResolved);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            if ((uVar2 & 1) == 0) {
              return;
            }
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 1) break;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 2) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"vertex_weights");
              if (iVar3 == 0) {
                return;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4a0,"Expected end of <vertex_weights> element.",&local_4a1
                        );
              ThrowException(this,&local_4a0);
            }
          }
          bVar1 = IsElement(this,"input");
          if ((!bVar1) || (channel.mResolved == (Accessor *)0x0)) break;
          Collada::InputChannel::InputChannel((InputChannel *)local_68);
          local_6c = GetAttribute(this,"semantic");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_6c);
          pcStack_88 = (char *)CONCAT44(extraout_var,iVar3);
          attrSource._4_4_ = GetAttribute(this,"source");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)attrSource._4_4_);
          pcStack_98 = (char *)CONCAT44(extraout_var_00,iVar3);
          local_9c = TestAttribute(this,"offset");
          if (-1 < (int)local_9c) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)local_9c);
            channel.mIndex = (size_t)iVar3;
          }
          if (*pcStack_98 != '#') {
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter(&local_238);
            pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )&local_238,(char (*) [28])"Unsupported URL format in \"");
            pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<(pbVar4,&stack0xffffffffffffff68);
            pbVar5 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<(pbVar4,(char (*) [63])
                                       "\" in source attribute of <vertex_weights> data <input> element"
                               );
            Formatter::basic_formatter::operator_cast_to_string(&local_c0,pbVar5);
            ThrowException(this,&local_c0);
          }
          std::__cxx11::string::operator=((string *)&channel.mOffset,pcStack_98 + 1);
          iVar3 = strcmp(pcStack_88,"JOINT");
          if (iVar3 == 0) {
            Collada::InputChannel::operator=
                      (&pController->mWeightInputJoints,(InputChannel *)local_68);
          }
          else {
            iVar3 = strcmp(pcStack_88,"WEIGHT");
            if (iVar3 != 0) {
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)&text);
              pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&text,(char (*) [19])"Unknown semantic \"");
              pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator<<(pbVar4,&stack0xffffffffffffff78);
              pbVar5 = (basic_formatter *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator<<(pbVar4,(char (*) [43])
                                           "\" in <vertex_weights> data <input> element");
              Formatter::basic_formatter::operator_cast_to_string(&local_258,pbVar5);
              ThrowException(this,&local_258);
            }
            Collada::InputChannel::operator=
                      (&pController->mWeightInputWeights,(InputChannel *)local_68);
          }
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((uVar2 & 1) == 0) {
            SkipElement(this);
          }
          Collada::InputChannel::~InputChannel((InputChannel *)local_68);
        }
        bVar1 = IsElement(this,"vcount");
        if ((!bVar1) || (channel.mResolved == (Accessor *)0x0)) break;
        numWeights = (size_t)GetTextContent(this);
        it._M_current = (unsigned_long *)0x0;
        local_3e8._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&pController->mWeightCounts);
        while( true ) {
          local_3f0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (&pController->mWeightCounts);
          bVar1 = __gnu_cxx::operator!=(&local_3e8,&local_3f0);
          if (!bVar1) break;
          if (*(char *)numWeights == '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_410,"Out of data while reading <vcount>",
                       (allocator *)((long)&text_1 + 7));
            ThrowException(this,&local_410);
          }
          uVar2 = strtoul10((char *)numWeights,(char **)&numWeights);
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_3e8);
          *puVar6 = (ulong)uVar2;
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_3e8);
          it._M_current = *puVar6 + it._M_current;
          SkipSpacesAndLineEnd<char>((char **)&numWeights);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_3e8);
        }
        TestClosing(this,"vcount");
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::resize(&pController->mWeights,(size_type)it._M_current);
      }
      bVar1 = IsElement(this,"v");
      if ((bVar1) && (channel.mResolved != (Accessor *)0x0)) break;
      SkipElement(this);
    }
    it_1._M_current = (pair<unsigned_long,_unsigned_long> *)GetTextContent(this);
    local_428._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::begin(&pController->mWeights);
    while( true ) {
      local_430._M_current =
           (pair<unsigned_long,_unsigned_long> *)
           std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::end(&pController->mWeights);
      bVar1 = __gnu_cxx::operator!=(&local_428,&local_430);
      if (!bVar1) break;
      if ((char)(it_1._M_current)->first == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_450,"Out of data while reading <vertex_weights>",&local_451);
        ThrowException(this,&local_450);
      }
      uVar2 = strtoul10((char *)it_1._M_current,(char **)&it_1);
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator->(&local_428);
      ppVar7->first = (ulong)uVar2;
      SkipSpacesAndLineEnd<char>((char **)&it_1);
      if ((char)(it_1._M_current)->first == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_478,"Out of data while reading <vertex_weights>",&local_479);
        ThrowException(this,&local_478);
      }
      uVar2 = strtoul10((char *)it_1._M_current,(char **)&it_1);
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator->(&local_428);
      ppVar7->second = (ulong)uVar2;
      SkipSpacesAndLineEnd<char>((char **)&it_1);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++(&local_428);
    }
    TestClosing(this,"v");
  } while( true );
}

Assistant:

void ColladaParser::ReadControllerWeights(Collada::Controller& pController)
{
    // read vertex count from attributes and resize the array accordingly
    int indexCount = GetAttribute("count");
    size_t vertexCount = (size_t)mReader->getAttributeValueAsInt(indexCount);
    pController.mWeightCounts.resize(vertexCount);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for weight data. Two possible semantics: "JOINT" and "WEIGHT"
            if (IsElement("input") && vertexCount > 0)
            {
                InputChannel channel;

                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);
                int indexOffset = TestAttribute("offset");
                if (indexOffset >= 0)
                    channel.mOffset = mReader->getAttributeValueAsInt(indexOffset);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <vertex_weights> data <input> element");
                channel.mAccessor = attrSource + 1;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mWeightInputJoints = channel;
                else if (strcmp(attrSemantic, "WEIGHT") == 0)
                    pController.mWeightInputWeights = channel;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <vertex_weights> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("vcount") && vertexCount > 0)
            {
                // read weight count per vertex
                const char* text = GetTextContent();
                size_t numWeights = 0;
                for (std::vector<size_t>::iterator it = pController.mWeightCounts.begin(); it != pController.mWeightCounts.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vcount>");

                    *it = strtoul10(text, &text);
                    numWeights += *it;
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("vcount");

                // reserve weight count
                pController.mWeights.resize(numWeights);
            }
            else if (IsElement("v") && vertexCount > 0)
            {
                // read JointIndex - WeightIndex pairs
                const char* text = GetTextContent();

                for (std::vector< std::pair<size_t, size_t> >::iterator it = pController.mWeights.begin(); it != pController.mWeights.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->first = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->second = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("v");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertex_weights") != 0)
                ThrowException("Expected end of <vertex_weights> element.");

            break;
        }
    }
}